

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O2

idx_t __thiscall duckdb::CachingFileHandle::GetFileSize(CachingFileHandle *this)

{
  FileHandle *this_00;
  idx_t iVar1;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> guard;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> uStack_18;
  
  if (((this->file_handle).
       super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl == (FileHandle *)0x0) &&
     (this->validate != true)) {
    StorageLock::GetSharedLock((StorageLock *)&uStack_18);
    iVar1 = this->cached_file->file_size;
    ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
    ~unique_ptr(&uStack_18);
    return iVar1;
  }
  this_00 = GetFileHandle(this);
  iVar1 = FileHandle::GetFileSize(this_00);
  return iVar1;
}

Assistant:

idx_t CachingFileHandle::GetFileSize() {
	if (file_handle || validate) {
		return GetFileHandle().GetFileSize();
	}
	auto guard = cached_file.lock.GetSharedLock();
	return cached_file.FileSize(guard);
}